

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_ext_gstate.c
# Opt level: O3

HPDF_STATUS HPDF_ExtGState_SetAlphaFill(HPDF_ExtGState ext_gstate,HPDF_REAL value)

{
  HPDF_STATUS HVar1;
  
  HVar1 = ExtGState_Check(ext_gstate);
  if (HVar1 != 0) {
    return HVar1;
  }
  if ((0.0 <= value) && (value <= 1.0)) {
    HVar1 = HPDF_Dict_AddReal(ext_gstate,"ca",value);
    return HVar1;
  }
  HVar1 = HPDF_RaiseError(ext_gstate->error,0x1080,0);
  return HVar1;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_ExtGState_SetAlphaFill  (HPDF_ExtGState   ext_gstate,
                              HPDF_REAL        value)
{
    HPDF_STATUS ret = ExtGState_Check (ext_gstate);
    
    if (ret != HPDF_OK)
        return ret;

    if (value < 0 || value > 1.0f)
        return HPDF_RaiseError (ext_gstate->error, 
                HPDF_EXT_GSTATE_OUT_OF_RANGE, 0);

    return HPDF_Dict_AddReal (ext_gstate, "ca", value);
}